

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer.c
# Opt level: O1

void print_symbol_list(TextBuffer *buf,LuaSymbolList *list,int level,char *delimiter)

{
  bool bVar1;
  bool bVar2;
  LuaSymbol *sym;
  undefined4 in_register_00000014;
  PtrListIterator nodeiter__;
  PtrListIterator local_48;
  
  raviX_ptrlist_forward_iterator(&local_48,(PtrList *)list);
  sym = (LuaSymbol *)raviX_ptrlist_iter_next(&local_48);
  if (sym != (LuaSymbol *)0x0) {
    bVar2 = true;
    do {
      bVar1 = bVar2;
      if (bVar2) {
        bVar1 = false;
      }
      if (!(bool)(delimiter == (char *)0x0 | bVar2)) {
        printf_buf(buf,"%p%s\n",CONCAT44(in_register_00000014,level),delimiter);
        bVar1 = bVar2;
      }
      print_symbol(buf,sym,level + 1);
      sym = (LuaSymbol *)raviX_ptrlist_iter_next(&local_48);
      bVar2 = bVar1;
    } while (sym != (LuaSymbol *)0x0);
  }
  return;
}

Assistant:

static void print_symbol_list(TextBuffer *buf, LuaSymbolList *list, int level, const char *delimiter)
{
	LuaSymbol *node;
	bool is_first = true;
	FOR_EACH_PTR(list, LuaSymbol, node)
	{
		if (is_first)
			is_first = false;
		else if (delimiter)
			printf_buf(buf, "%p%s\n", level, delimiter);
		print_symbol(buf, node, level + 1);
	}
	END_FOR_EACH_PTR(node);
}